

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::rotateLeft
          (BTreeImpl *this,Parent *left,Parent *right,Parent *parent,uint indexInParent,
          MaybeUint **fixup)

{
  bool bVar1;
  size_t mid;
  Fault f_1;
  Fault local_40;
  Fault f;
  MaybeUint **fixup_local;
  uint indexInParent_local;
  Parent *parent_local;
  Parent *right_local;
  Parent *left_local;
  BTreeImpl *this_local;
  
  f.exception = (Exception *)fixup;
  bVar1 = Parent::isHalfFull(left);
  if (!bVar1) {
    Debug::Fault::Fault(&local_40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x2c2,FAILED,"left.isHalfFull()","");
    Debug::Fault::fatal(&local_40);
  }
  bVar1 = Parent::isMostlyFull(right);
  if (!bVar1) {
    Debug::Fault::Fault((Fault *)&mid,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x2c3,FAILED,"right.isMostlyFull()","");
    Debug::Fault::fatal((Fault *)&mid);
  }
  left->keys[3].i = parent->keys[indexInParent].i;
  if ((MaybeUint *)((f.exception)->ownFile).content.ptr == parent->keys + indexInParent) {
    ((f.exception)->ownFile).content.ptr = (char *)(left->keys + 3);
  }
  parent->keys[indexInParent].i = right->keys[0].i;
  left->children[4] = right->children[0];
  amove<kj::_::BTreeImpl::MaybeUint>(right->keys,right->keys + 1,6);
  MaybeUint::operator=(right->keys + 6,(void *)0x0);
  amove<unsigned_int>(right->children,right->children + 1,7);
  right->children[7] = 0;
  return;
}

Assistant:

void BTreeImpl::rotateLeft(
    Parent& left, Parent& right, Parent& parent, uint indexInParent, MaybeUint*& fixup) {
  // Steal one item from the right node and move it to the left node.

  // Like merge(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(left.isHalfFull());
  KJ_DASSERT(right.isMostlyFull());

  constexpr size_t mid = Parent::NKEYS/2;
  left.keys[mid] = parent.keys[indexInParent];
  if (fixup == &parent.keys[indexInParent]) fixup = &left.keys[mid];
  parent.keys[indexInParent] = right.keys[0];
  left.children[mid + 1] = right.children[0];
  amove(right.keys, right.keys + 1, Parent::NKEYS - 1);
  right.keys[Parent::NKEYS - 1] = nullptr;
  amove(right.children, right.children + 1, Parent::NCHILDREN - 1);
  right.children[Parent::NCHILDREN - 1] = 0;
}